

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O2

void __thiscall
Sequence::insert_freqarray(Sequence *this,shared_ptr<Lists<std::shared_ptr<Eqclass>_>_> *LargeL)

{
  element_type *peVar1;
  uint uVar2;
  shared_ptr<Lists<std::shared_ptr<Itemset>_>_> *psVar3;
  Eqclass_S cluster;
  shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> hdr1;
  shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_> chd;
  shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> hdr2;
  __shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> local_48;
  
  local_58._M_ptr = (element_type *)0x0;
  local_58._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78._M_ptr = (element_type *)0x0;
  local_78._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48._M_ptr = (element_type *)0x0;
  local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88._M_ptr = (Eqclass *)0x0;
  local_88._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_68,
             (__shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2> *)
             (LargeL->
             super___shared_ptr<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  std::__shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_58,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  while (local_58._M_ptr != (element_type *)0x0) {
    std::__shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_88,
               &((local_58._M_ptr)->theItem).super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>
              );
    psVar3 = Eqclass::list(local_88._M_ptr);
    std::__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr((__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_68,
                 (__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
                 (psVar3->
                 super___shared_ptr<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
    std::__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_78,
               (__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
               &local_68);
    while( true ) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
      peVar1 = local_78._M_ptr;
      if (local_78._M_ptr == (element_type *)0x0) break;
      uVar2 = Eqclass::templ(local_88._M_ptr);
      add_freq(this,&peVar1->theItem,uVar2);
      std::__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *
                   )&local_68,
                   (__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *
                   )local_78._M_ptr);
      std::__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_78,
                 (__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_68);
    }
    psVar3 = Eqclass::list2(local_88._M_ptr);
    std::__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr((__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_68,
                 (__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
                 (psVar3->
                 super___shared_ptr<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
    std::__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_48,
               (__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
               &local_68);
    while( true ) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
      peVar1 = local_48._M_ptr;
      if (local_48._M_ptr == (element_type *)0x0) break;
      uVar2 = Eqclass::templ2(local_88._M_ptr);
      add_freq(this,&peVar1->theItem,uVar2);
      std::__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *
                   )&local_68,
                   (__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *
                   )local_48._M_ptr);
      std::__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_48,
                 (__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_68);
    }
    std::__shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_68,
                 (__shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2> *)
                 local_58._M_ptr);
    std::__shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_58,&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  return;
}

Assistant:

void Sequence::insert_freqarray(shared_ptr<Lists<Eqclass_S>>& LargeL) {
    //insert frequent itemsets into hash table
    shared_ptr<ListNodes<Eqclass_S>> chd;
    shared_ptr<ListNodes<shared_ptr<Itemset>>> hdr1, hdr2;
    Eqclass_S cluster;

    chd = LargeL->head();
    for (; chd; chd = chd->next()) {
        cluster = chd->item();
        hdr1 = cluster->list()->head();
        for (; hdr1; hdr1 = hdr1->next()) {
            add_freq(hdr1->item(), cluster->templ());
            //hdr1->item()->print_seq(seqstrm, cluster->templ());
        }
        hdr2 = cluster->list2()->head();
        for (; hdr2; hdr2 = hdr2->next()) {
            add_freq(hdr2->item(), cluster->templ2());
            //hdr2->item()->print_seq(seqstrm, cluster->templ2());
        }
    }
}